

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  bool bVar1;
  ulong uVar2;
  CURLUcode CVar3;
  CURLcode CVar4;
  CURLUcode CVar5;
  void *pvVar6;
  Curl_handler *pCVar7;
  char *pcVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  char **optionsp_00;
  ulong uVar15;
  undefined7 in_register_00000089;
  ulong uVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  char *passwdp;
  char *userp;
  char *optionsp;
  char *local_70;
  char *local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  char *local_40;
  char *local_38;
  
  local_38 = (char *)CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000089,has_scheme));
  CVar5 = CURLUE_OK;
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  local_40 = (char *)0x0;
  pvVar6 = memchr(auth,0x40,authlen);
  if (pvVar6 == (void *)0x0) {
LAB_00163f05:
    (*Curl_cfree)(local_68);
    (*Curl_cfree)(local_70);
    (*Curl_cfree)(local_40);
    u->user = (char *)0x0;
    u->password = (char *)0x0;
    u->options = (char *)0x0;
    lVar18 = 0;
  }
  else {
    if (u->scheme == (char *)0x0) {
      pCVar7 = (Curl_handler *)0x0;
    }
    else {
      pCVar7 = Curl_get_scheme_handler(u->scheme);
    }
    lVar18 = (long)pvVar6 + (1 - (long)auth);
    if ((pCVar7 == (Curl_handler *)0x0) || ((pCVar7->flags & 0x400) == 0)) {
      optionsp_00 = (char **)0x0;
    }
    else {
      optionsp_00 = &local_40;
    }
    CVar4 = Curl_parse_login_details(auth,lVar18 - 1,&local_68,&local_70,optionsp_00);
    CVar5 = CURLUE_BAD_LOGIN;
    if (CVar4 != CURLE_OK) goto LAB_00163f05;
    if (local_68 != (char *)0x0) {
      CVar5 = CURLUE_USER_NOT_ALLOWED;
      if ((flags & 0x20) != 0) goto LAB_00163f05;
      (*Curl_cfree)(u->user);
      u->user = local_68;
    }
    if (local_70 != (char *)0x0) {
      (*Curl_cfree)(u->password);
      u->password = local_70;
    }
    CVar5 = CURLUE_OK;
    if (local_40 != (char *)0x0) {
      (*Curl_cfree)(u->options);
      u->options = local_40;
    }
  }
  if (CVar5 != CURLUE_OK) {
    return CVar5;
  }
  CVar4 = Curl_dyn_addn(host,auth + lVar18,authlen - lVar18);
  if (CVar4 != CURLE_OK) {
    if (CVar4 != CURLE_TOO_LARGE) {
      return CURLUE_OUT_OF_MEMORY;
    }
    return CURLUE_TOO_LARGE;
  }
  pcVar8 = Curl_dyn_ptr(host);
  if (*pcVar8 == '[') {
    pcVar9 = strchr(pcVar8,0x5d);
    if (pcVar9 == (char *)0x0) {
      CVar5 = CURLUE_BAD_IPV6;
      goto LAB_00164118;
    }
    if (pcVar9[1] == ':') {
      pcVar9 = pcVar9 + 1;
    }
    else {
      CVar5 = CURLUE_BAD_PORT_NUMBER;
      if (pcVar9[1] != '\0') goto LAB_00164118;
      pcVar9 = (char *)0x0;
    }
  }
  else {
    pcVar9 = strchr(pcVar8,0x3a);
  }
  if (pcVar9 != (char *)0x0) {
    local_68 = (char *)0x0;
    Curl_dyn_setlen(host,(long)pcVar9 - (long)pcVar8);
    if (pcVar9[1] == '\0') {
      CVar3 = (uint)(byte)((byte)local_38 ^ 1) << 2;
LAB_0016410f:
      CVar5 = CVar3;
      bVar19 = false;
    }
    else {
      CVar5 = CURLUE_BAD_PORT_NUMBER;
      CVar3 = CURLUE_BAD_PORT_NUMBER;
      if (9 < (byte)(pcVar9[1] - 0x30U)) goto LAB_0016410f;
      piVar10 = __errno_location();
      *piVar10 = 0;
      uVar11 = strtoul(pcVar9 + 1,&local_68,10);
      bVar19 = false;
      if ((*piVar10 == 0) && (uVar11 < 0x10000)) {
        if (*local_68 != '\0') goto LAB_0016410f;
        u->portnum = (unsigned_short)uVar11;
        (*Curl_cfree)(u->port);
        pcVar8 = curl_maprintf("%ld",uVar11);
        u->port = pcVar8;
        bVar19 = pcVar8 != (char *)0x0;
        CVar5 = CURLUE_OUT_OF_MEMORY;
      }
    }
    if (!bVar19) goto LAB_00164118;
  }
  CVar5 = CURLUE_OK;
LAB_00164118:
  if (CVar5 == CURLUE_OK) {
    sVar12 = Curl_dyn_len(host);
    if (sVar12 == 0) {
      CVar5 = CURLUE_NO_HOST;
    }
    else {
      pcVar8 = Curl_dyn_ptr(host);
      local_58 = 0;
      uStack_50 = 0;
      local_68 = (char *)0x0;
      uStack_60 = 0;
      uVar14 = 3;
      if (*pcVar8 != '[') {
        piVar10 = __errno_location();
        *piVar10 = 0;
        bVar19 = false;
        iVar17 = 0;
        do {
          uVar2 = uStack_50;
          uVar16 = local_58;
          uVar11 = uStack_60;
          pcVar9 = local_68;
          if (bVar19) {
            CVar4 = CURLE_OK;
            switch(iVar17) {
            case 0:
              Curl_dyn_reset(host);
              pcVar9 = (char *)((ulong)local_68 >> 0x18);
              uVar13 = (ulong)((uint)((ulong)local_68 >> 0x10) & 0xff);
              uVar15 = (ulong)((uint)((ulong)local_68 >> 8) & 0xff);
              uVar16 = (ulong)((uint)local_68 & 0xff);
              break;
            case 1:
              uVar14 = 1;
              if (0xffffff < uStack_60 || (char *)0xff < local_68) goto LAB_001643bd;
              Curl_dyn_reset(host);
              uVar13 = uVar11 >> 0x10 & 0xffff;
              uVar15 = (ulong)((uint)(uVar11 >> 8) & 0xff);
              pcVar9 = (char *)((ulong)pcVar9 & 0xffffffff);
              uVar16 = (ulong)((uint)uVar11 & 0xff);
              break;
            case 2:
              uVar14 = 1;
              if (0xffff < local_58 || (0xff < uStack_60 || (char *)0xff < local_68))
              goto LAB_001643bd;
              Curl_dyn_reset(host);
              uVar15 = uVar16 >> 8 & 0xffffff;
              uVar16 = uVar16 & 0xff;
              pcVar9 = (char *)((ulong)pcVar9 & 0xffffffff);
              uVar13 = uVar11 & 0xffffffff;
              break;
            case 3:
              uVar14 = 1;
              if ((0xff < uStack_50 || 0xff < local_58) ||
                  (0xff < uStack_60 || (char *)0xff < local_68)) goto LAB_001643bd;
              local_38 = local_68;
              Curl_dyn_reset(host);
              uVar13 = uVar11 & 0xffffffff;
              uVar15 = uVar16 & 0xffffffff;
              uVar16 = uVar2 & 0xffffffff;
              pcVar9 = local_38;
              break;
            default:
              goto switchD_00164233_default;
            }
            CVar4 = Curl_dyn_addf(host,"%u.%u.%u.%u",pcVar9,uVar13,uVar15,uVar16);
switchD_00164233_default:
            uVar14 = -(uint)(CVar4 != CURLE_OK) | 2;
            goto LAB_001643bd;
          }
          local_70 = (char *)0x0;
          if (9 < (byte)(*pcVar8 - 0x30U)) goto LAB_001641e1;
          pcVar9 = (char *)strtoul(pcVar8,&local_70,0);
          bVar1 = false;
          if ((*piVar10 == 0) && (bVar1 = false, (ulong)pcVar9 >> 0x20 == 0)) {
            (&local_68)[iVar17] = pcVar9;
            pcVar8 = local_70;
            if (*local_70 == '\0') {
              bVar19 = true;
LAB_001641f9:
              bVar1 = true;
            }
            else {
              if (*local_70 == '.') {
                if (iVar17 != 3) {
                  iVar17 = iVar17 + 1;
                  pcVar8 = local_70 + 1;
                  goto LAB_001641f9;
                }
                iVar17 = 3;
              }
LAB_001641e1:
              bVar1 = false;
            }
          }
        } while (bVar1);
        uVar14 = 1;
      }
LAB_001643bd:
      switch(uVar14) {
      case 0:
        CVar5 = urldecode_host(host);
        if (CVar5 == CURLUE_OK) {
          pcVar8 = Curl_dyn_ptr(host);
          sVar12 = Curl_dyn_len(host);
          CVar5 = hostname_check(u,pcVar8,sVar12);
        }
        break;
      case 1:
        CVar5 = CURLUE_OK;
        break;
      case 2:
        pcVar8 = Curl_dyn_ptr(host);
        sVar12 = Curl_dyn_len(host);
        CVar5 = ipv6_parse(u,pcVar8,sVar12);
        break;
      default:
        CVar5 = CURLUE_BAD_HOSTNAME;
      }
    }
  }
  return CVar5;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}